

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O1

Option * __thiscall
CLI::App::add_option
          (App *this,string *option_name,callback_t *option_callback,string *option_description,
          bool defaulted,
          function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
          *func)

{
  pointer *ppuVar1;
  pointer pcVar2;
  unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *puVar3;
  App *pAVar4;
  iterator __position;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()> *__x;
  bool bVar5;
  __normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
  _Var6;
  Option *pOVar7;
  OptionAlreadyAdded *pOVar8;
  string *__rhs;
  pointer pbVar9;
  char cVar10;
  undefined7 in_register_00000081;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs_00;
  unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *puVar11;
  pointer puVar12;
  pointer __rhs_01;
  __uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_> *this_00;
  string test_name;
  Option myopt;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_520;
  App *local_500;
  undefined4 local_4f4;
  vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
  *local_4f0;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  *local_4e8;
  callback_t *local_4e0;
  string *local_4d8;
  string *local_4d0;
  pointer local_4c8;
  _Any_data local_4c0;
  code *local_4b0;
  _Any_data local_4a0;
  code *local_490;
  string local_480;
  string local_460;
  string local_440;
  string local_420;
  string local_400;
  string local_3e0;
  string local_3c0;
  string local_3a0;
  string local_380;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_360;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_340;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_320;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_300;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c0;
  string local_2a0;
  Option local_280;
  
  local_4f4 = (undefined4)CONCAT71(in_register_00000081,defaulted);
  pcVar2 = (option_name->_M_dataplus)._M_p;
  local_4d0 = option_name;
  local_400._M_dataplus._M_p = (pointer)&local_400.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_400,pcVar2,pcVar2 + option_name->_M_string_length);
  pcVar2 = (option_description->_M_dataplus)._M_p;
  local_4d8 = option_description;
  local_420._M_dataplus._M_p = (pointer)&local_420.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_420,pcVar2,pcVar2 + option_description->_M_string_length);
  std::
  function<bool_(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
  ::function((function<bool_(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
              *)&local_4a0,option_callback);
  Option::Option(&local_280,&local_400,&local_420,(callback_t *)&local_4a0,this,
                 this->allow_non_standard_options_);
  if (local_490 != (code *)0x0) {
    (*local_490)(&local_4a0,&local_4a0,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_420._M_dataplus._M_p != &local_420.field_2) {
    operator_delete(local_420._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_400._M_dataplus._M_p != &local_400.field_2) {
    operator_delete(local_400._M_dataplus._M_p);
  }
  local_4e0 = option_callback;
  _Var6 = ::std::
          __find_if<__gnu_cxx::__normal_iterator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>*,std::vector<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>,std::allocator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>>>>,__gnu_cxx::__ops::_Iter_pred<CLI::App::add_option(std::__cxx11::string,std::function<bool(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)>,std::__cxx11::string,bool,std::function<std::__cxx11::string()>)::_lambda(std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>const&)_1_>>
                    ((this->options_).
                     super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     (this->options_).
                     super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,&local_280);
  local_4f0 = &this->options_;
  puVar3 = (this->options_).
           super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (_Var6._M_current != puVar3) {
    puVar11 = (local_4f0->
              super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    if (puVar11 != puVar3) {
      do {
        __rhs = Option::matching_name_abi_cxx11_
                          ((puVar11->_M_t).
                           super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>.
                           _M_t.
                           super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                           super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl,&local_280);
        if (__rhs->_M_string_length != 0) {
          pOVar8 = (OptionAlreadyAdded *)__cxa_allocate_exception(0x38);
          ::std::operator+(&local_360,"added option matched existing option name: ",__rhs);
          OptionAlreadyAdded::OptionAlreadyAdded(pOVar8,&local_360);
          __cxa_throw(pOVar8,&OptionAlreadyAdded::typeinfo,Error::~Error);
        }
        puVar11 = puVar11 + 1;
      } while (puVar11 != puVar3);
    }
    pOVar8 = (OptionAlreadyAdded *)__cxa_allocate_exception(0x38);
    local_3e0._M_dataplus._M_p = (pointer)&local_3e0.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_3e0,"added option matched existing option name","");
    OptionAlreadyAdded::OptionAlreadyAdded(pOVar8,&local_3e0);
    __cxa_throw(pOVar8,&OptionAlreadyAdded::typeinfo,Error::~Error);
  }
  local_500 = this;
  local_4e8 = func;
  if ((local_280.lnames_.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start ==
       local_280.lnames_.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish) &&
     (local_280.snames_.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_280.snames_.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)) {
    if ((local_280.lnames_.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start ==
         local_280.lnames_.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish) &&
       (local_280.lnames_.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             local_280.snames_.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
       local_280.snames_.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start ==
       local_280.snames_.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish)) {
      local_280.lnames_.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           &local_280.pname_ + (local_280.pname_._M_string_length == 0);
    }
    ::std::operator+(&local_520,"--",
                     local_280.lnames_.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start);
    if (local_520._M_string_length == 3) {
      ::std::__cxx11::string::erase((ulong)&local_520,0);
    }
    local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2a0,local_520._M_dataplus._M_p,
               local_520._M_dataplus._M_p + local_520._M_string_length);
    pOVar7 = get_option_no_throw(this,&local_2a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
      operator_delete(local_2a0._M_dataplus._M_p);
    }
    if ((pOVar7 != (Option *)0x0) && ((pOVar7->super_OptionBase<CLI::Option>).configurable_ == true)
       ) {
      pOVar8 = (OptionAlreadyAdded *)__cxa_allocate_exception(0x38);
      ::std::operator+(&local_2c0,"added option positional name matches existing option: ",
                       &local_520);
      OptionAlreadyAdded::OptionAlreadyAdded(pOVar8,&local_2c0);
      __cxa_throw(pOVar8,&OptionAlreadyAdded::typeinfo,Error::~Error);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_520._M_dataplus._M_p != &local_520.field_2) {
      operator_delete(local_520._M_dataplus._M_p);
    }
  }
  else if (this->parent_ != (App *)0x0) {
    if (local_280.lnames_.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_280.lnames_.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pbVar9 = local_280.lnames_.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      do {
        pAVar4 = local_500->parent_;
        pcVar2 = (pbVar9->_M_dataplus)._M_p;
        local_380._M_dataplus._M_p = (pointer)&local_380.field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_380,pcVar2,pcVar2 + pbVar9->_M_string_length);
        pOVar7 = get_option_no_throw(pAVar4,&local_380);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_380._M_dataplus._M_p != &local_380.field_2) {
          operator_delete(local_380._M_dataplus._M_p);
        }
        if ((pOVar7 != (Option *)0x0) &&
           ((pOVar7->super_OptionBase<CLI::Option>).configurable_ == true)) {
          pOVar8 = (OptionAlreadyAdded *)__cxa_allocate_exception(0x38);
          ::std::operator+(&local_2e0,"added option matches existing positional option: ",pbVar9);
          OptionAlreadyAdded::OptionAlreadyAdded(pOVar8,&local_2e0);
          __cxa_throw(pOVar8,&OptionAlreadyAdded::typeinfo,Error::~Error);
        }
        pbVar9 = pbVar9 + 1;
      } while (pbVar9 != local_280.lnames_.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    }
    pbVar9 = local_280.snames_.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    this = local_500;
    if (local_280.snames_.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_280.snames_.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      __rhs_01 = local_280.snames_.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      do {
        pAVar4 = local_500->parent_;
        pcVar2 = (__rhs_01->_M_dataplus)._M_p;
        local_3a0._M_dataplus._M_p = (pointer)&local_3a0.field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_3a0,pcVar2,pcVar2 + __rhs_01->_M_string_length);
        pOVar7 = get_option_no_throw(pAVar4,&local_3a0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
          operator_delete(local_3a0._M_dataplus._M_p);
        }
        if ((pOVar7 != (Option *)0x0) &&
           ((pOVar7->super_OptionBase<CLI::Option>).configurable_ == true)) {
          pOVar8 = (OptionAlreadyAdded *)__cxa_allocate_exception(0x38);
          ::std::operator+(&local_300,"added option matches existing positional option: ",__rhs_01);
          OptionAlreadyAdded::OptionAlreadyAdded(pOVar8,&local_300);
          __cxa_throw(pOVar8,&OptionAlreadyAdded::typeinfo,Error::~Error);
        }
        __rhs_01 = __rhs_01 + 1;
        this = local_500;
      } while (__rhs_01 != pbVar9);
    }
  }
  if ((this->allow_non_standard_options_ == true) &&
     (local_280.snames_.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_280.snames_.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)) {
    pbVar9 = local_280.snames_.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      if (1 < pbVar9->_M_string_length) {
        local_520._M_dataplus._M_p = (pointer)&local_520.field_2;
        local_520._M_string_length = 0;
        local_520.field_2._M_local_buf[0] = '\0';
        ::std::__cxx11::string::push_back((char)&local_520);
        ::std::__cxx11::string::push_back((char)&local_520);
        local_3c0._M_dataplus._M_p = (pointer)&local_3c0.field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_3c0,local_520._M_dataplus._M_p,
                   local_520._M_dataplus._M_p + local_520._M_string_length);
        pOVar7 = get_option_no_throw(local_500,&local_3c0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3c0._M_dataplus._M_p != &local_3c0.field_2) {
          operator_delete(local_3c0._M_dataplus._M_p);
        }
        if (pOVar7 != (Option *)0x0) {
          pOVar8 = (OptionAlreadyAdded *)__cxa_allocate_exception(0x38);
          ::std::operator+(&local_320,"added option interferes with existing short option: ",pbVar9)
          ;
          OptionAlreadyAdded::OptionAlreadyAdded(pOVar8,&local_320);
          __cxa_throw(pOVar8,&OptionAlreadyAdded::typeinfo,Error::~Error);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_520._M_dataplus._M_p != &local_520.field_2) {
          operator_delete(local_520._M_dataplus._M_p);
        }
      }
      pbVar9 = pbVar9 + 1;
    } while (pbVar9 != local_280.snames_.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
    puVar12 = (local_500->options_).
              super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    local_4c8 = (local_500->options_).
                super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar12 != local_4c8) {
      do {
        pOVar7 = (puVar12->_M_t).
                 super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                 super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                 super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
        pbVar9 = *(pointer *)
                  ((long)&(pOVar7->snames_).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  + 8);
        for (__rhs_00 = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                         &(pOVar7->snames_).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl; __rhs_00 != pbVar9; __rhs_00 = __rhs_00 + 1) {
          if (1 < __rhs_00->_M_string_length) {
            local_520._M_dataplus._M_p = (pointer)&local_520.field_2;
            local_520._M_string_length = 0;
            local_520.field_2._M_local_buf[0] = '\0';
            ::std::__cxx11::string::push_back((char)&local_520);
            local_440._M_dataplus._M_p = (pointer)&local_440.field_2;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_440,local_520._M_dataplus._M_p,
                       local_520._M_dataplus._M_p + local_520._M_string_length);
            bVar5 = Option::check_sname(&local_280,&local_440);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_440._M_dataplus._M_p != &local_440.field_2) {
              operator_delete(local_440._M_dataplus._M_p);
            }
            if (bVar5) {
              pOVar8 = (OptionAlreadyAdded *)__cxa_allocate_exception(0x38);
              ::std::operator+(&local_340,
                               "added option interferes with existing non standard option: ",
                               __rhs_00);
              OptionAlreadyAdded::OptionAlreadyAdded(pOVar8,&local_340);
              __cxa_throw(pOVar8,&OptionAlreadyAdded::typeinfo,Error::~Error);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_520._M_dataplus._M_p != &local_520.field_2) {
              operator_delete(local_520._M_dataplus._M_p);
            }
          }
        }
        puVar12 = puVar12 + 1;
      } while (puVar12 != local_4c8);
    }
  }
  pAVar4 = local_500;
  __position._M_current =
       (local_500->options_).
       super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (local_500->options_).
      super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
    ::_M_realloc_insert<>(local_4f0,__position);
    cVar10 = (char)local_4f4;
  }
  else {
    ((__position._M_current)->_M_t).
    super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
    super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
    super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl = (Option *)0x0;
    ppuVar1 = &(local_500->options_).
               super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppuVar1 = *ppuVar1 + 1;
    cVar10 = (char)local_4f4;
  }
  puVar12 = (pAVar4->options_).
            super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  pOVar7 = (Option *)operator_new(0x250);
  pcVar2 = (local_4d0->_M_dataplus)._M_p;
  local_460._M_dataplus._M_p = (pointer)&local_460.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_460,pcVar2,pcVar2 + local_4d0->_M_string_length);
  pcVar2 = (local_4d8->_M_dataplus)._M_p;
  local_480._M_dataplus._M_p = (pointer)&local_480.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_480,pcVar2,pcVar2 + local_4d8->_M_string_length);
  std::
  function<bool_(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
  ::function((function<bool_(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
              *)&local_4c0,local_4e0);
  Option::Option(pOVar7,&local_460,&local_480,(callback_t *)&local_4c0,pAVar4,
                 pAVar4->allow_non_standard_options_);
  this_00 = (__uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_> *)(puVar12 + -1);
  std::__uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>::reset(this_00,pOVar7);
  if (local_4b0 != (code *)0x0) {
    (*local_4b0)(&local_4c0,&local_4c0,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_480._M_dataplus._M_p != &local_480.field_2) {
    operator_delete(local_480._M_dataplus._M_p);
  }
  __x = local_4e8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_460._M_dataplus._M_p != &local_460.field_2) {
    operator_delete(local_460._M_dataplus._M_p);
  }
  std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  ::operator=(&((this_00->_M_t).
                super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl)->default_function_,__x);
  if (cVar10 != '\0') {
    Option::capture_default_str
              ((this_00->_M_t).
               super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
               super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl);
  }
  OptionBase<CLI::OptionDefaults>::copy_to<CLI::Option>
            (&(pAVar4->option_defaults_).super_OptionBase<CLI::OptionDefaults>,
             (this_00->_M_t).
             super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
             super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl);
  if ((cVar10 == '\0') &&
     (pOVar7 = (this_00->_M_t).
               super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
               super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl,
     (pOVar7->super_OptionBase<CLI::Option>).always_capture_default_ == true)) {
    Option::capture_default_str(pOVar7);
  }
  pOVar7 = (this_00->_M_t).super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
           super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
  Option::~Option(&local_280);
  return pOVar7;
}

Assistant:

CLI11_INLINE Option *App::add_option(std::string option_name,
                                     callback_t option_callback,
                                     std::string option_description,
                                     bool defaulted,
                                     std::function<std::string()> func) {
    Option myopt{option_name, option_description, option_callback, this, allow_non_standard_options_};

    if(std::find_if(std::begin(options_), std::end(options_), [&myopt](const Option_p &v) { return *v == myopt; }) ==
       std::end(options_)) {
        if(myopt.lnames_.empty() && myopt.snames_.empty()) {
            // if the option is positional only there is additional potential for ambiguities in config files and needs
            // to be checked
            std::string test_name = "--" + myopt.get_single_name();
            if(test_name.size() == 3) {
                test_name.erase(0, 1);
            }

            auto *op = get_option_no_throw(test_name);
            if(op != nullptr && op->get_configurable()) {
                throw(OptionAlreadyAdded("added option positional name matches existing option: " + test_name));
            }
        } else if(parent_ != nullptr) {
            for(auto &ln : myopt.lnames_) {
                auto *op = parent_->get_option_no_throw(ln);
                if(op != nullptr && op->get_configurable()) {
                    throw(OptionAlreadyAdded("added option matches existing positional option: " + ln));
                }
            }
            for(auto &sn : myopt.snames_) {
                auto *op = parent_->get_option_no_throw(sn);
                if(op != nullptr && op->get_configurable()) {
                    throw(OptionAlreadyAdded("added option matches existing positional option: " + sn));
                }
            }
        }
        if(allow_non_standard_options_ && !myopt.snames_.empty()) {
            for(auto &sname : myopt.snames_) {
                if(sname.length() > 1) {
                    std::string test_name;
                    test_name.push_back('-');
                    test_name.push_back(sname.front());
                    auto *op = get_option_no_throw(test_name);
                    if(op != nullptr) {
                        throw(OptionAlreadyAdded("added option interferes with existing short option: " + sname));
                    }
                }
            }
            for(auto &opt : options_) {
                for(const auto &osn : opt->snames_) {
                    if(osn.size() > 1) {
                        std::string test_name;
                        test_name.push_back(osn.front());
                        if(myopt.check_sname(test_name)) {
                            throw(OptionAlreadyAdded("added option interferes with existing non standard option: " +
                                                     osn));
                        }
                    }
                }
            }
        }
        options_.emplace_back();
        Option_p &option = options_.back();
        option.reset(new Option(option_name, option_description, option_callback, this, allow_non_standard_options_));

        // Set the default string capture function
        option->default_function(func);

        // For compatibility with CLI11 1.7 and before, capture the default string here
        if(defaulted)
            option->capture_default_str();

        // Transfer defaults to the new option
        option_defaults_.copy_to(option.get());

        // Don't bother to capture if we already did
        if(!defaulted && option->get_always_capture_default())
            option->capture_default_str();

        return option.get();
    }
    // we know something matches now find what it is so we can produce more error information
    for(auto &opt : options_) {
        const auto &matchname = opt->matching_name(myopt);
        if(!matchname.empty()) {
            throw(OptionAlreadyAdded("added option matched existing option name: " + matchname));
        }
    }
    // this line should not be reached the above loop should trigger the throw
    throw(OptionAlreadyAdded("added option matched existing option name"));  // LCOV_EXCL_LINE
}